

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestNestedMessageHasBits_NestedMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  TestNestedMessageHasBits_NestedMessage **v1;
  TestNestedMessageHasBits_NestedMessage **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedField<int> *this;
  RepeatedField<int> *other;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  RepeatedPtrField<edition_unittest::ForeignMessage> *other_00;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestNestedMessageHasBits_NestedMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestNestedMessageHasBits_NestedMessage *from;
  TestNestedMessageHasBits_NestedMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestNestedMessageHasBits_NestedMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestNestedMessageHasBits_NestedMessage *)to_msg;
  _this = (TestNestedMessageHasBits_NestedMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestNestedMessageHasBits_NestedMessage_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestNestedMessageHasBits_NestedMessage*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestNestedMessageHasBits_NestedMessage_const*,edition_unittest::TestNestedMessageHasBits_NestedMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x66ab,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_nestedmessage_repeated_int32(from);
  other = _internal_nestedmessage_repeated_int32
                    ((TestNestedMessageHasBits_NestedMessage *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(this,other);
  this_00 = _internal_mutable_nestedmessage_repeated_foreignmessage(from);
  other_00 = _internal_nestedmessage_repeated_foreignmessage
                       ((TestNestedMessageHasBits_NestedMessage *)absl_log_internal_check_op_result)
  ;
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::MergeFrom(this_00,other_00);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestNestedMessageHasBits_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedMessageHasBits_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestNestedMessageHasBits_NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_nestedmessage_repeated_int32()->MergeFrom(from._internal_nestedmessage_repeated_int32());
  _this->_internal_mutable_nestedmessage_repeated_foreignmessage()->MergeFrom(
      from._internal_nestedmessage_repeated_foreignmessage());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}